

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

bool EqualRegion(QRegionPrivate *r1,QRegionPrivate *r2)

{
  bool bVar1;
  const_pointer lhs;
  int *in_RSI;
  int *in_RDI;
  int i;
  QRect *rr2;
  QRect *rr1;
  QRect *in_stack_ffffffffffffffb8;
  QRect *in_stack_ffffffffffffffc0;
  int local_2c;
  bool local_1;
  
  if (*in_RDI == *in_RSI) {
    if (*in_RDI == 0) {
      local_1 = true;
    }
    else {
      bVar1 = operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (bVar1) {
        local_1 = false;
      }
      else if ((*in_RDI == 1) && (*in_RSI == 1)) {
        local_1 = true;
      }
      else {
        if (*in_RDI != 1) {
          QList<QRect>::constData((QList<QRect> *)0x655af9);
        }
        if (*in_RSI == 1) {
          lhs = (const_pointer)(in_RSI + 8);
        }
        else {
          lhs = QList<QRect>::constData((QList<QRect> *)0x655b30);
        }
        for (local_2c = 0; local_2c < *in_RDI; local_2c = local_2c + 1) {
          bVar1 = operator!=(lhs,in_stack_ffffffffffffffb8);
          if (bVar1) {
            return false;
          }
        }
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool EqualRegion(const QRegionPrivate *r1, const QRegionPrivate *r2)
{
    if (r1->numRects != r2->numRects) {
        return false;
    } else if (r1->numRects == 0) {
        return true;
    } else if (r1->extents != r2->extents) {
        return false;
    } else if (r1->numRects == 1 && r2->numRects == 1) {
        return true; // equality tested in previous if-statement
    } else {
        const QRect *rr1 = (r1->numRects == 1) ? &r1->extents : r1->rects.constData();
        const QRect *rr2 = (r2->numRects == 1) ? &r2->extents : r2->rects.constData();
        for (int i = 0; i < r1->numRects; ++i, ++rr1, ++rr2) {
            if (*rr1 != *rr2)
                return false;
        }
    }

    return true;
}